

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlByteConsumed(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_48;
  undefined *local_40;
  PyObject *pyobj_ctxt;
  xmlParserCtxtPtr ctxt;
  long c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = libxml_deprecationWarning("xmlByteConsumed");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _PyArg_ParseTuple_SizeT(py_retval,"O:xmlByteConsumed",&local_40);
    if (iVar1 == 0) {
      self_local = (PyObject *)0x0;
    }
    else {
      if (local_40 == &_Py_NoneStruct) {
        local_48 = (PyObject *)0x0;
      }
      else {
        local_48 = *(PyObject **)(local_40 + 0x10);
      }
      pyobj_ctxt = local_48;
      ctxt = (xmlParserCtxtPtr)xmlByteConsumed(local_48);
      self_local = libxml_longWrap((long)ctxt);
    }
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlByteConsumed(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    long c_retval;
    xmlParserCtxtPtr ctxt;
    PyObject *pyobj_ctxt;

    if (libxml_deprecationWarning("xmlByteConsumed") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"O:xmlByteConsumed", &pyobj_ctxt))
        return(NULL);
    ctxt = (xmlParserCtxtPtr) PyparserCtxt_Get(pyobj_ctxt);

    c_retval = xmlByteConsumed(ctxt);
    py_retval = libxml_longWrap((long) c_retval);
    return(py_retval);
}